

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O2

int readline_memory(char *line,size_t line_size,char *filedata,size_t filedata_len,
                   size_t *filedata_offset)

{
  char cVar1;
  void *pvVar2;
  ulong __n;
  
  pvVar2 = *(void **)filedata_len;
  for (__n = 0; (((__n < 0x7f && ((char *)((long)pvVar2 + __n) < filedata)) &&
                 (cVar1 = *(char *)((long)(line_size + (long)pvVar2) + __n), cVar1 != '\n')) &&
                (cVar1 != '\r')); __n = __n + 1) {
  }
  if (__n != 0) {
    pvVar2 = memcpy(line,(void *)(line_size + (long)pvVar2),__n);
    *(ulong *)filedata_len = *(long *)filedata_len + __n;
  }
  line[__n] = '\0';
  *(long *)filedata_len = *(long *)filedata_len + 1;
  return (int)pvVar2;
}

Assistant:

static int
readline_memory(char *line, size_t line_size,
                const char *filedata, size_t filedata_len,
                size_t *filedata_offset)
{
    size_t off, len;

    off = *filedata_offset;

    for(len = 0; off + len < filedata_len && len < line_size - 1; len++) {
        if(filedata[off + len] == '\n' ||
            filedata[off + len] == '\r') {
                break;
        }
    }

    if(len) {
        memcpy(line, filedata + off, len);
        *filedata_offset += len;
    }

    line[len] = '\0';
    *filedata_offset += 1;

    return 0;
}